

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::TestTexture::TestTexture
          (TestTexture *this,CompressedTexFormat *format,int width,int height,int depth)

{
  this->_vptr_TestTexture = (_func_int **)&PTR__TestTexture_00bcdbd8;
  (this->m_compressedLevels).
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_compressedLevels).
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_compressedLevels).
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TestTexture::TestTexture (const tcu::CompressedTexFormat& format, int width, int height, int depth)
{
	DE_ASSERT(width >= 1);
	DE_ASSERT(height >= 1);
	DE_ASSERT(depth >= 1);

	DE_UNREF(format);
	DE_UNREF(width);
	DE_UNREF(height);
	DE_UNREF(depth);
}